

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::setDataKey(QPDFWriter *this,int objid)

{
  element_type *peVar1;
  string local_30;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDF::compute_data_key
            (&local_30,&peVar1->encryption_key,objid,0,peVar1->encrypt_use_aes,peVar1->encryption_V,
             peVar1->encryption_R);
  std::__cxx11::string::operator=
            ((string *)
             &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->cur_data_key,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::setDataKey(int objid)
{
    m->cur_data_key = QPDF::compute_data_key(
        m->encryption_key, objid, 0, m->encrypt_use_aes, m->encryption_V, m->encryption_R);
}